

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O3

void __thiscall
glcts::MultisampleTextureDependenciesTexParameterTest::checkAllTexParameterInvocations
          (MultisampleTextureDependenciesTexParameterTest *this,GLenum expected_error_code,
          GLint value,GLenum pname,GLenum texture_target)

{
  ostringstream *poVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  TestError *this_00;
  GLint int_value;
  GLfloat float_value;
  GLint local_1b8;
  float local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1b4 = (float)value;
  local_1b8 = value;
  (**(code **)(lVar4 + 0x1350))(texture_target,pname);
  GVar3 = (**(code **)(lVar4 + 0x800))();
  if (GVar3 == expected_error_code) {
    (**(code **)(lVar4 + 0x1360))(texture_target,pname,value);
    GVar3 = (**(code **)(lVar4 + 0x800))();
    if (GVar3 == expected_error_code) {
      (**(code **)(lVar4 + 0x1358))(texture_target,pname,&local_1b4);
      GVar3 = (**(code **)(lVar4 + 0x800))();
      if (GVar3 == expected_error_code) {
        (**(code **)(lVar4 + 0x1368))(texture_target,pname,&local_1b8);
        GVar3 = (**(code **)(lVar4 + 0x800))();
        if (GVar3 == expected_error_code) {
          return;
        }
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"glTexParameteriv() call generated an error ",0x2b);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," instead of the expected error code ",0x24);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"glTexParameteriv() call generated an unexpected error.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                   ,0x8fc);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"glTexParameterfv() call generated an error ",0x2b);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," instead of the expected error code ",0x24);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"glTexParameterfv() call generated an unexpected error.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                   ,0x8ef);
      }
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glTexParameteri() call generated an error ",0x2a);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," instead of the expected error code ",0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"glTexParameterf() call generated an unexpected error.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                 ,0x8e2);
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"glTexParameterf() call generated an error ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," instead of the expected error code ",0x24);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"glTexParameterf() call generated an unexpected error.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
               ,0x8d5);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MultisampleTextureDependenciesTexParameterTest::checkAllTexParameterInvocations(glw::GLenum expected_error_code,
																					 glw::GLint  value,
																					 glw::GLenum pname,
																					 glw::GLenum texture_target)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum		   error_code  = GL_NO_ERROR;
	const glw::GLfloat float_value = (glw::GLfloat)value;
	const glw::GLint   int_value   = value;

	/* glTexParameterf() */
	gl.texParameterf(texture_target, pname, float_value);

	error_code = gl.getError();

	if (error_code != expected_error_code)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameterf() call generated an error " << error_code
						   << " instead of the expected error code " << expected_error_code << tcu::TestLog::EndMessage;

		TCU_FAIL("glTexParameterf() call generated an unexpected error.");
	}

	/* glTexParameteri() */
	gl.texParameteri(texture_target, pname, int_value);

	error_code = gl.getError();

	if (error_code != expected_error_code)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameteri() call generated an error " << error_code
						   << " instead of the expected error code " << expected_error_code << tcu::TestLog::EndMessage;

		TCU_FAIL("glTexParameterf() call generated an unexpected error.");
	}

	/* glTexParameterfv() */
	gl.texParameterfv(texture_target, pname, &float_value);

	error_code = gl.getError();

	if (error_code != expected_error_code)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameterfv() call generated an error " << error_code
						   << " instead of the expected error code " << expected_error_code << tcu::TestLog::EndMessage;

		TCU_FAIL("glTexParameterfv() call generated an unexpected error.");
	}

	/* glTexParameteriv() */
	gl.texParameteriv(texture_target, pname, &int_value);

	error_code = gl.getError();

	if (error_code != expected_error_code)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameteriv() call generated an error " << error_code
						   << " instead of the expected error code " << expected_error_code << tcu::TestLog::EndMessage;

		TCU_FAIL("glTexParameteriv() call generated an unexpected error.");
	}
}